

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O1

void add_light(chunk_conflict *c,player *p,loc_conflict sgrid,wchar_t radius,wchar_t inten)

{
  int *piVar1;
  uint uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t y;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  loc_conflict grid2;
  loc grid;
  wchar_t wVar9;
  wchar_t x;
  wchar_t x_00;
  int iVar10;
  bool bVar11;
  int local_38;
  
  if (L'\xffffffff' < radius) {
    wVar9 = -radius;
    iVar6 = radius * 2 + 1;
    iVar10 = iVar6;
    x_00 = wVar9;
    y = wVar9;
    do {
      grid2 = loc(x_00,y);
      grid = (loc)loc_sum(sgrid,grid2);
      local_38 = sgrid.y;
      uVar7 = grid.y - local_38;
      uVar2 = -uVar7;
      if (0 < (int)uVar7) {
        uVar2 = uVar7;
      }
      uVar8 = grid.x - sgrid.x;
      uVar7 = -uVar8;
      if (0 < (int)uVar8) {
        uVar7 = uVar8;
      }
      wVar3 = (uVar2 >> 1) + uVar7;
      if (uVar7 < uVar2) {
        wVar3 = (uVar7 >> 1) + uVar2;
      }
      _Var5 = square_in_bounds(c,grid);
      if ((((_Var5) && (wVar3 <= radius)) && (_Var5 = los(c,sgrid,(loc_conflict)grid), _Var5)) &&
         ((_Var5 = square_allowslos(c,grid), _Var5 ||
          (_Var5 = source_can_light_wall(c,p,sgrid,(loc_conflict)grid), _Var5)))) {
        wVar4 = -wVar3;
        if (inten < L'\x01') {
          wVar4 = wVar3;
        }
        piVar1 = &c->squares[(long)grid >> 0x20][grid.x].light;
        *piVar1 = *piVar1 + wVar4 + inten;
      }
      iVar10 = iVar10 + -1;
      x_00 = x_00 + L'\x01';
    } while ((iVar10 != 0) ||
            (bVar11 = y != radius, iVar10 = iVar6, x_00 = wVar9, y = y + L'\x01', bVar11));
  }
  return;
}

Assistant:

static void add_light(struct chunk *c, struct player *p, struct loc sgrid,
		int radius, int inten)
{
	int y;

	for (y = -radius; y <= radius; y++) {
		int x;

		for (x = -radius; x <= radius; x++) {
			struct loc grid = loc_sum(sgrid, loc(x, y));
			int dist = distance(sgrid, grid);
			if (!square_in_bounds(c, grid)) continue;
			if (dist > radius) continue;
			/* Don't propagate the light through walls. */
			if (!los(c, sgrid, grid)) continue;
			/*
			 * Only light a wall if the face lit is possibly visible
			 * to the player.
			 */
			if (!square_allowslos(c, grid) && !source_can_light_wall(c,
					p, sgrid, grid)) continue;
			/* Adjust the light level */
			if (inten > 0) {
				/* Light getting less further away */
				c->squares[grid.y][grid.x].light +=
					inten - dist;
			} else {
				/* Light getting greater further away */
				c->squares[grid.y][grid.x].light +=
					inten + dist;
			}
		}
	}
}